

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O3

int main(int argc,char **argv)

{
  size_t __size;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  GLFWmonitor *handle;
  GLFWwindow *handle_00;
  GLFWgammaramp *pGVar4;
  unsigned_short *puVar5;
  unsigned_short *__dest;
  float gamma_value;
  int height;
  int width;
  GLFWgammaramp orig_ramp;
  float local_74;
  int local_70;
  int local_6c;
  unsigned_short *local_68;
  undefined8 uStack_60;
  unsigned_short *local_58;
  GLFWgammaramp local_50;
  
  local_74 = 1.0;
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    handle = glfwGetPrimaryMonitor();
    handle_00 = glfwCreateWindow(800,400,"Gamma Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle_00 != (GLFWwindow *)0x0) {
      pGVar4 = glfwGetGammaRamp(handle);
      local_50.size = pGVar4->size;
      __size = (ulong)local_50.size * 2;
      puVar5 = (unsigned_short *)malloc(__size);
      local_68 = puVar5;
      local_50.red = puVar5;
      __dest = (unsigned_short *)malloc(__size);
      local_50.green = __dest;
      local_58 = (unsigned_short *)malloc(__size);
      local_50.blue = local_58;
      memcpy(puVar5,pGVar4->red,__size);
      memcpy(__dest,pGVar4->green,__size);
      memcpy(local_58,pGVar4->blue,__size);
      glfwMakeContextCurrent(handle_00);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(1);
      nk_glfw3_init(handle_00,NK_GLFW3_INSTALL_CALLBACKS);
      memset(&glfw.atlas,0,400);
      glfw.atlas.temporary.alloc = nk_malloc;
      glfw.atlas.temporary.free = nk_mfree;
      glfw.atlas.permanent.alloc = nk_malloc;
      glfw.atlas.permanent.free = nk_mfree;
      nk_font_atlas_begin(&glfw.atlas);
      nk_glfw3_font_stash_end();
      glfwSetKeyCallback(handle_00,key_callback);
      iVar3 = glfwWindowShouldClose(handle_00);
      puVar5 = local_68;
      while (iVar3 == 0) {
        glfwGetWindowSize(handle_00,&local_6c,&local_70);
        local_68 = (unsigned_short *)CONCAT44((float)local_70,(float)local_6c);
        uStack_60 = 0;
        auVar2._4_4_ = (float)local_70;
        auVar2._0_4_ = (float)local_6c;
        auVar2._8_8_ = 0;
        nk_window_set_bounds(&glfw.ctx,"",(nk_rect)(auVar2 << 0x40));
        (*glad_glClear)(0x4000);
        nk_glfw3_new_frame();
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_68;
        iVar3 = nk_begin_titled(&glfw.ctx,"","",(nk_rect)(auVar1 << 0x40),0);
        if (iVar3 != 0) {
          nk_row_layout(&glfw.ctx,NK_DYNAMIC,30.0,3,0);
          iVar3 = nk_slider_float(&glfw.ctx,0.1,&local_74,5.0,0.1);
          if (iVar3 != 0) {
            glfwSetGamma(handle,local_74);
          }
          nk_labelf(&glfw.ctx,0x11,"%0.1f",(double)local_74);
          iVar3 = nk_button_text_styled(&glfw.ctx,&glfw.ctx.style.button,"Revert",6);
          if (iVar3 != 0) {
            glfwSetGammaRamp(handle,&local_50);
          }
          pGVar4 = glfwGetGammaRamp(handle);
          puVar5 = (unsigned_short *)0x0;
          nk_row_layout(&glfw.ctx,NK_DYNAMIC,(float)local_70 + -60.0,3,0);
          chart_ramp_array((nk_context *)0xff0000ff,(nk_color)pGVar4->size,(int)pGVar4->red,puVar5);
          chart_ramp_array((nk_context *)0xff00ff00,(nk_color)pGVar4->size,(int)pGVar4->green,puVar5
                          );
          chart_ramp_array((nk_context *)0xffff0000,(nk_color)pGVar4->size,(int)pGVar4->blue,puVar5)
          ;
        }
        nk_end(&glfw.ctx);
        nk_glfw3_render(NK_ANTI_ALIASING_ON);
        glfwSwapBuffers(handle_00);
        glfwWaitEventsTimeout(1.0);
        iVar3 = glfwWindowShouldClose(handle_00);
        puVar5 = local_50.red;
      }
      free(puVar5);
      free(local_50.green);
      free(local_50.blue);
      nk_glfw3_shutdown();
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;
    GLFWgammaramp orig_ramp;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;
    float gamma_value = 1.f;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    monitor = glfwGetPrimaryMonitor();

    window = glfwCreateWindow(800, 400, "Gamma Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    {
        const GLFWgammaramp* ramp = glfwGetGammaRamp(monitor);
        const size_t array_size = ramp->size * sizeof(short);
        orig_ramp.size = ramp->size;
        orig_ramp.red = malloc(array_size);
        orig_ramp.green = malloc(array_size);
        orig_ramp.blue = malloc(array_size);
        memcpy(orig_ramp.red, ramp->red, array_size);
        memcpy(orig_ramp.green, ramp->green, array_size);
        memcpy(orig_ramp.blue, ramp->blue, array_size);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        struct nk_rect area;

        glfwGetWindowSize(window, &width, &height);
        area = nk_rect(0.f, 0.f, (float) width, (float) height);
        nk_window_set_bounds(nk, "", area);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();
        if (nk_begin(nk, "", area, 0))
        {
            const GLFWgammaramp* ramp;

            nk_layout_row_dynamic(nk, 30, 3);
            if (nk_slider_float(nk, 0.1f, &gamma_value, 5.f, 0.1f))
                glfwSetGamma(monitor, gamma_value);
            nk_labelf(nk, NK_TEXT_LEFT, "%0.1f", gamma_value);
            if (nk_button_label(nk, "Revert"))
                glfwSetGammaRamp(monitor, &orig_ramp);

            ramp = glfwGetGammaRamp(monitor);

            nk_layout_row_dynamic(nk, height - 60.f, 3);
            chart_ramp_array(nk, nk_rgb(255, 0, 0), ramp->size, ramp->red);
            chart_ramp_array(nk, nk_rgb(0, 255, 0), ramp->size, ramp->green);
            chart_ramp_array(nk, nk_rgb(0, 0, 255), ramp->size, ramp->blue);
        }

        nk_end(nk);
        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        glfwSwapBuffers(window);
        glfwWaitEventsTimeout(1.0);
    }

    free(orig_ramp.red);
    free(orig_ramp.green);
    free(orig_ramp.blue);

    nk_glfw3_shutdown();
    glfwTerminate();
    exit(EXIT_SUCCESS);
}